

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O3

void add_substitution(bsdtar *bsdtar,char *rule_text)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  subst_rule *psVar4;
  subst_rule *psVar5;
  subst_rule *psVar6;
  char *pcVar7;
  char *pcVar8;
  byte *pbVar9;
  int *piVar10;
  size_t sVar11;
  char buf [80];
  char acStack_88 [88];
  
  psVar4 = (subst_rule *)bsdtar->substitution;
  if (psVar4 == (subst_rule *)0x0) {
    psVar4 = (subst_rule *)calloc(1,0x10);
    bsdtar->substitution = (substitution *)psVar4;
    if (psVar4 != (subst_rule *)0x0) goto LAB_0010dc09;
  }
  else {
LAB_0010dc09:
    psVar5 = (subst_rule *)malloc(0x58);
    if (psVar5 != (subst_rule *)0x0) {
      psVar5->next = (subst_rule *)0x0;
      psVar5->result = (char *)0x0;
      psVar6 = (subst_rule *)(psVar4->re).buffer;
      if (psVar6 == (subst_rule *)0x0) {
        psVar6 = psVar4;
      }
      psVar6->next = psVar5;
      (psVar4->re).buffer = (re_dfa_t *)psVar5;
      if (*rule_text == 0) {
        pcVar7 = "Empty replacement string";
      }
      else {
        pcVar7 = strchr(rule_text + 1,(int)*rule_text);
        if (pcVar7 != (char *)0x0) {
          sVar11 = (long)pcVar7 - (long)rule_text;
          pcVar8 = (char *)malloc(sVar11);
          if (pcVar8 != (char *)0x0) {
            memcpy(pcVar8,rule_text + 1,sVar11 - 1);
            pcVar8[sVar11 - 1] = '\0';
            iVar3 = regcomp((regex_t *)&psVar5->re,pcVar8,0);
            if (iVar3 != 0) {
              regerror(iVar3,(regex_t *)&psVar5->re,acStack_88,0x50);
              lafe_errc(1,0,"Invalid regular expression: %s",acStack_88);
            }
            free(pcVar8);
            pcVar7 = pcVar7 + 1;
            pbVar9 = (byte *)strchr(pcVar7,(int)*rule_text);
            if (pbVar9 == (byte *)0x0) goto LAB_0010ddc5;
            sVar11 = (long)pbVar9 - (long)pcVar7;
            pcVar8 = (char *)malloc(sVar11 + 1);
            psVar5->result = pcVar8;
            if (pcVar8 != (char *)0x0) {
              memcpy(pcVar8,pcVar7,sVar11);
              pcVar8[sVar11] = '\0';
              bVar2 = psVar5->field_0x50 & 0xc0 | 0x1c;
LAB_0010dd07:
              do {
                while( true ) {
                  while( true ) {
                    pbVar9 = pbVar9 + 1;
                    psVar5->field_0x50 = bVar2;
                    bVar1 = *pbVar9;
                    if (bVar1 < 0x62) break;
                    if (bVar1 < 0x70) {
                      if (bVar1 == 0x62) goto LAB_0010dd79;
                      if (bVar1 == 0x67) goto LAB_0010dd70;
                      if (bVar1 != 0x68) goto LAB_0010dd98;
                      bVar2 = bVar2 | 0x10;
                    }
                    else {
                      if (bVar1 == 0x70) goto LAB_0010dd6c;
                      if (bVar1 == 0x72) {
                        bVar2 = bVar2 | 4;
                      }
                      else {
                        if (bVar1 != 0x73) goto LAB_0010dd98;
                        bVar2 = bVar2 | 8;
                      }
                    }
                  }
                  if (bVar1 < 0x50) break;
                  if (bVar1 == 0x50) {
LAB_0010dd6c:
                    bVar2 = bVar2 | 2;
                  }
                  else if (bVar1 == 0x52) {
                    bVar2 = bVar2 & 0xfb;
                  }
                  else {
                    if (bVar1 != 0x53) goto LAB_0010dd98;
                    bVar2 = bVar2 & 0xf7;
                  }
                }
                if (0x46 < bVar1) {
                  if (bVar1 == 0x47) {
LAB_0010dd70:
                    bVar2 = bVar2 | 1;
                  }
                  else {
                    if (bVar1 != 0x48) goto LAB_0010dd98;
                    bVar2 = bVar2 & 0xef;
                  }
                  goto LAB_0010dd07;
                }
                if (bVar1 != 0x42) {
                  if (bVar1 == 0) {
                    return;
                  }
LAB_0010dd98:
                  lafe_errc(1,0,"Invalid replacement flag %c",(ulong)(uint)(int)(char)bVar1);
                }
LAB_0010dd79:
                bVar2 = bVar2 | 0x20;
              } while( true );
            }
          }
          goto LAB_0010ddb0;
        }
LAB_0010ddc5:
        pcVar7 = "Invalid replacement string";
      }
      iVar3 = 0;
      goto LAB_0010dddc;
    }
  }
LAB_0010ddb0:
  piVar10 = __errno_location();
  iVar3 = *piVar10;
  pcVar7 = "Out of memory";
LAB_0010dddc:
  lafe_errc(1,iVar3,pcVar7);
}

Assistant:

void
add_substitution(struct bsdtar *bsdtar, const char *rule_text)
{
	struct subst_rule *rule;
	struct substitution *subst;
	const char *end_pattern, *start_subst;
	char *pattern;
	int r;

	if ((subst = bsdtar->substitution) == NULL) {
		init_substitution(bsdtar);
		subst = bsdtar->substitution;
	}

	rule = malloc(sizeof(*rule));
	if (rule == NULL)
		lafe_errc(1, errno, "Out of memory");
	rule->next = NULL;
	rule->result = NULL;

	if (subst->last_rule == NULL)
		subst->first_rule = rule;
	else
		subst->last_rule->next = rule;
	subst->last_rule = rule;

	if (*rule_text == '\0')
		lafe_errc(1, 0, "Empty replacement string");
	end_pattern = strchr(rule_text + 1, *rule_text);
	if (end_pattern == NULL)
		lafe_errc(1, 0, "Invalid replacement string");

	pattern = malloc(end_pattern - rule_text);
	if (pattern == NULL)
		lafe_errc(1, errno, "Out of memory");
	memcpy(pattern, rule_text + 1, end_pattern - rule_text - 1);
	pattern[end_pattern - rule_text - 1] = '\0';

	if ((r = regcomp(&rule->re, pattern, REG_BASIC)) != 0) {
		char buf[80];
		regerror(r, &rule->re, buf, sizeof(buf));
		lafe_errc(1, 0, "Invalid regular expression: %s", buf);
	}
	free(pattern);

	start_subst = end_pattern + 1;
	end_pattern = strchr(start_subst, *rule_text);
	if (end_pattern == NULL)
		lafe_errc(1, 0, "Invalid replacement string");

	rule->result = malloc(end_pattern - start_subst + 1);
	if (rule->result == NULL)
		lafe_errc(1, errno, "Out of memory");
	memcpy(rule->result, start_subst, end_pattern - start_subst);
	rule->result[end_pattern - start_subst] = '\0';

	/* Defaults */
	rule->global = 0; /* Don't do multiple replacements. */
	rule->print = 0; /* Don't print. */
	rule->regular = 1; /* Rewrite regular filenames. */
	rule->symlink = 1; /* Rewrite symlink targets. */
	rule->hardlink = 1; /* Rewrite hardlink targets. */
	rule->from_begin = 0; /* Don't match from start. */

	while (*++end_pattern) {
		switch (*end_pattern) {
		case 'b':
		case 'B':
			rule->from_begin = 1;
			break;
		case 'g':
		case 'G':
			rule->global = 1;
			break;
		case 'h':
			rule->hardlink = 1;
			break;
		case 'H':
			rule->hardlink = 0;
			break;
		case 'p':
		case 'P':
			rule->print = 1;
			break;
		case 'r':
			rule->regular = 1;
			break;
		case 'R':
			rule->regular = 0;
			break;
		case 's':
			rule->symlink = 1;
			break;
		case 'S':
			rule->symlink = 0;
			break;
		default:
			lafe_errc(1, 0, "Invalid replacement flag %c", *end_pattern);
			/* NOTREACHED */
		}
	}
}